

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

Lf_Man_t * Lf_ManAlloc(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  size_t __size;
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  Lf_Man_t *pLVar4;
  word *pwVar5;
  Vec_Mem_t *p;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Lf_Bst_t *pLVar8;
  void **ppvVar9;
  float *pfVar10;
  abctime aVar11;
  long lVar12;
  Gia_Obj_t *pGVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  timespec ts;
  timespec local_40;
  long lVar19;
  
  if (0x1e < pPars->nCutNum - 2U) {
    __assert_fail("pPars->nCutNum > 1 && pPars->nCutNum <= LF_CUT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,0x795,"Lf_Man_t *Lf_ManAlloc(Gia_Man_t *, Jf_Par_t *)");
  }
  if (0xb < pPars->nLutSize - 2U) {
    __assert_fail("pPars->nLutSize > 1 && pPars->nLutSize <= LF_LEAF_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,0x796,"Lf_Man_t *Lf_ManAlloc(Gia_Man_t *, Jf_Par_t *)");
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  pVVar6 = pGia->vMapping;
  if (pVVar6 != (Vec_Int_t *)0x0) {
    if (pVVar6->pArray != (int *)0x0) {
      free(pVVar6->pArray);
      pGia->vMapping->pArray = (int *)0x0;
      pVVar6 = pGia->vMapping;
      if (pVVar6 == (Vec_Int_t *)0x0) goto LAB_0076e0fc;
    }
    free(pVVar6);
    pGia->vMapping = (Vec_Int_t *)0x0;
  }
LAB_0076e0fc:
  Gia_ManCleanValue(pGia);
  if (pGia->pSibls != (int *)0x0) {
    Gia_ManSetPhase(pGia);
  }
  pLVar4 = (Lf_Man_t *)calloc(1,0x1a0);
  Lf_ManAnalyzeCoDrivers(pGia,&pLVar4->nCoDrivers,&pLVar4->nInverters);
  if (pPars->fPower != 0) {
    Lf_ManComputeSwitching(pGia,&pLVar4->vSwitches);
  }
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    aVar11 = -1;
  }
  else {
    aVar11 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  pLVar4->clkStart = aVar11;
  pLVar4->pGia = pGia;
  pLVar4->pPars = pPars;
  iVar2 = pPars->nLutSize;
  iVar15 = (int)((long)iVar2 + 7U >> 1);
  pLVar4->nCutWords = iVar15;
  pLVar4->nSetWords = iVar15 * pPars->nCutNum;
  if (pPars->fCutMin == 0) {
    pLVar4->vTtMem = (Vec_Mem_t *)0x0;
  }
  else {
    iVar15 = 1 << ((char)iVar2 - 6U & 0x1f);
    if (iVar2 < 7) {
      iVar15 = 1;
    }
    __size = (long)iVar15 * 8;
    pwVar5 = (word *)malloc(__size);
    p = (Vec_Mem_t *)calloc(1,0x30);
    p->nEntrySize = iVar15;
    p->LogPageSze = 0xc;
    p->PageMask = 0xfff;
    p->iPage = -1;
    uVar14 = 9999;
    while( true ) {
      do {
        uVar16 = uVar14;
        uVar14 = uVar16 + 1;
      } while ((uVar16 & 1) != 0);
      if (uVar14 < 9) break;
      iVar2 = 5;
      while (uVar14 % (iVar2 - 2U) != 0) {
        uVar3 = iVar2 * iVar2;
        iVar2 = iVar2 + 2;
        if (uVar14 < uVar3) goto LAB_0076e262;
      }
    }
LAB_0076e262:
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    uVar3 = 0x10;
    if (0xe < uVar16) {
      uVar3 = uVar14;
    }
    pVVar6->nCap = uVar3;
    piVar7 = (int *)malloc((long)(int)uVar3 << 2);
    pVVar6->pArray = piVar7;
    pVVar6->nSize = uVar14;
    if (piVar7 != (int *)0x0) {
      memset(piVar7,0xff,(long)(int)uVar14 << 2);
    }
    p->vTable = pVVar6;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 10000;
    pVVar6->nSize = 0;
    piVar7 = (int *)malloc(40000);
    pVVar6->pArray = piVar7;
    p->vNexts = pVVar6;
    memset(pwVar5,0,__size);
    iVar2 = Vec_MemHashInsert(p,pwVar5);
    if (iVar2 != 0) {
      __assert_fail("Value == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                    ,0x19e,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
    }
    memset(pwVar5,0xaa,__size);
    iVar2 = Vec_MemHashInsert(p,pwVar5);
    if (iVar2 != 1) {
      __assert_fail("Value == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                    ,0x1a3,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
    }
    if (pwVar5 != (word *)0x0) {
      free(pwVar5);
    }
    iVar2 = pPars->fCutMin;
    pLVar4->vTtMem = p;
    if ((iVar2 != 0) && (pPars->fUseMux7 != 0)) {
      iVar2 = 1 << ((char)pPars->nLutSize - 6U & 0x1f);
      if (pPars->nLutSize < 7) {
        iVar2 = 1;
      }
      pwVar5 = (word *)malloc((long)iVar2 << 3);
      memset(pwVar5,0xca,(long)iVar2 << 3);
      iVar2 = Vec_MemHashInsert(p,pwVar5);
      if (iVar2 != 2) {
        __assert_fail("Value == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                      ,0x1ac,"void Vec_MemAddMuxTT(Vec_Mem_t *, int)");
      }
      if (pwVar5 != (word *)0x0) {
        free(pwVar5);
      }
    }
  }
  pLVar8 = (Lf_Bst_t *)
           calloc((long)((~(pGia->vCos->nSize + pGia->vCis->nSize) + pGia->nObjs) - pGia->nBufs),
                  0x20);
  pLVar4->pObjBests = pLVar8;
  if ((pLVar4->vFreeSets).nCap < 0x4000) {
    piVar7 = (pLVar4->vFreeSets).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc(0x10000);
    }
    else {
      piVar7 = (int *)realloc(piVar7,0x10000);
    }
    (pLVar4->vFreeSets).pArray = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_0076e95b;
    (pLVar4->vFreeSets).nCap = 0x4000;
  }
  if ((pLVar4->vFreePages).nCap < 0x100) {
    ppvVar9 = (pLVar4->vFreePages).pArray;
    if (ppvVar9 == (void **)0x0) {
      ppvVar9 = (void **)malloc(0x800);
    }
    else {
      ppvVar9 = (void **)realloc(ppvVar9,0x800);
    }
    (pLVar4->vFreePages).pArray = ppvVar9;
    (pLVar4->vFreePages).nCap = 0x100;
  }
  (pLVar4->vStoreOld).nCutWords = 0;
  (pLVar4->vStoreOld).iCur = 0;
  (pLVar4->vStoreOld).vPages.nCap = 0;
  (pLVar4->vStoreOld).vPages.nSize = 0;
  (pLVar4->vStoreOld).vPages.pArray = (void **)0x0;
  (pLVar4->vStoreOld).LogPage = 0x10;
  (pLVar4->vStoreOld).MaskPage = 0xffff;
  iVar2 = pLVar4->nCutWords;
  iVar15 = (pLVar4->vOffsets).nCap;
  (pLVar4->vStoreOld).nCutWords = iVar2;
  (pLVar4->vStoreOld).vFree = &pLVar4->vFreePages;
  (pLVar4->vStoreNew).nCutWords = 0;
  (pLVar4->vStoreNew).iCur = 0;
  (pLVar4->vStoreNew).vPages.nCap = 0;
  (pLVar4->vStoreNew).vPages.nSize = 0;
  (pLVar4->vStoreNew).vPages.pArray = (void **)0x0;
  (pLVar4->vStoreNew).LogPage = 0x10;
  (pLVar4->vStoreNew).MaskPage = 0xffff;
  (pLVar4->vStoreNew).nCutWords = iVar2;
  (pLVar4->vStoreNew).vFree = &pLVar4->vFreePages;
  uVar14 = pGia->nObjs;
  if (iVar15 < (int)uVar14) {
    piVar7 = (pLVar4->vOffsets).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc((long)(int)uVar14 << 2);
    }
    else {
      piVar7 = (int *)realloc(piVar7,(long)(int)uVar14 << 2);
    }
    (pLVar4->vOffsets).pArray = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_0076e95b;
    (pLVar4->vOffsets).nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    memset((pLVar4->vOffsets).pArray,0xff,(ulong)uVar14 * 4);
  }
  (pLVar4->vOffsets).nSize = uVar14;
  uVar14 = pGia->nObjs;
  if ((pLVar4->vRequired).nCap < (int)uVar14) {
    piVar7 = (pLVar4->vRequired).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc((long)(int)uVar14 << 2);
    }
    else {
      piVar7 = (int *)realloc(piVar7,(long)(int)uVar14 << 2);
    }
    (pLVar4->vRequired).pArray = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_0076e95b;
    (pLVar4->vRequired).nCap = uVar14;
  }
  auVar1 = _DAT_0093d220;
  if (0 < (int)uVar14) {
    piVar7 = (pLVar4->vRequired).pArray;
    lVar12 = (ulong)uVar14 - 1;
    auVar17._8_4_ = (int)lVar12;
    auVar17._0_8_ = lVar12;
    auVar17._12_4_ = (int)((ulong)lVar12 >> 0x20);
    lVar12 = 0;
    auVar17 = auVar17 ^ _DAT_0093d220;
    auVar18 = _DAT_0093e4e0;
    auVar20 = _DAT_0093d210;
    do {
      auVar21 = auVar20 ^ auVar1;
      iVar2 = auVar17._4_4_;
      if ((bool)(~(auVar21._4_4_ == iVar2 && auVar17._0_4_ < auVar21._0_4_ || iVar2 < auVar21._4_4_)
                & 1)) {
        *(undefined4 *)((long)piVar7 + lVar12) = 1000000000;
      }
      if ((auVar21._12_4_ != auVar17._12_4_ || auVar21._8_4_ <= auVar17._8_4_) &&
          auVar21._12_4_ <= auVar17._12_4_) {
        *(undefined4 *)((long)piVar7 + lVar12 + 4) = 1000000000;
      }
      auVar21 = auVar18 ^ auVar1;
      iVar15 = auVar21._4_4_;
      if (iVar15 <= iVar2 && (iVar15 != iVar2 || auVar21._0_4_ <= auVar17._0_4_)) {
        *(undefined4 *)((long)piVar7 + lVar12 + 8) = 1000000000;
        *(undefined4 *)((long)piVar7 + lVar12 + 0xc) = 1000000000;
      }
      lVar19 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 4;
      auVar20._8_8_ = lVar19 + 4;
      lVar19 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 4;
      auVar18._8_8_ = lVar19 + 4;
      lVar12 = lVar12 + 0x10;
    } while ((ulong)(uVar14 + 3 >> 2) << 4 != lVar12);
  }
  (pLVar4->vRequired).nSize = uVar14;
  uVar14 = (~(pGia->vCos->nSize + pGia->vCis->nSize) + pGia->nObjs) - pGia->nBufs;
  if ((pLVar4->vCutSets).nCap < (int)uVar14) {
    piVar7 = (pLVar4->vCutSets).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc((long)(int)uVar14 << 2);
    }
    else {
      piVar7 = (int *)realloc(piVar7,(long)(int)uVar14 << 2);
    }
    (pLVar4->vCutSets).pArray = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_0076e95b;
    (pLVar4->vCutSets).nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    memset((pLVar4->vCutSets).pArray,0xff,(ulong)uVar14 << 2);
  }
  (pLVar4->vCutSets).nSize = uVar14;
  uVar14 = (~(pGia->vCos->nSize + pGia->vCis->nSize) + pGia->nObjs) - pGia->nBufs;
  if ((pLVar4->vFlowRefs).nCap < (int)uVar14) {
    pfVar10 = (pLVar4->vFlowRefs).pArray;
    if (pfVar10 == (float *)0x0) {
      pfVar10 = (float *)malloc((long)(int)uVar14 << 2);
    }
    else {
      pfVar10 = (float *)realloc(pfVar10,(long)(int)uVar14 << 2);
    }
    (pLVar4->vFlowRefs).pArray = pfVar10;
    (pLVar4->vFlowRefs).nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    memset((pLVar4->vFlowRefs).pArray,0,(ulong)uVar14 << 2);
  }
  (pLVar4->vFlowRefs).nSize = uVar14;
  uVar14 = (~(pGia->vCos->nSize + pGia->vCis->nSize) + pGia->nObjs) - pGia->nBufs;
  if ((pLVar4->vMapRefs).nCap < (int)uVar14) {
    piVar7 = (pLVar4->vMapRefs).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc((long)(int)uVar14 << 2);
    }
    else {
      piVar7 = (int *)realloc(piVar7,(long)(int)uVar14 << 2);
    }
    (pLVar4->vMapRefs).pArray = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_0076e95b;
    (pLVar4->vMapRefs).nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    memset((pLVar4->vMapRefs).pArray,0,(ulong)uVar14 << 2);
  }
  (pLVar4->vMapRefs).nSize = uVar14;
  uVar14 = pGia->vCis->nSize;
  if ((pLVar4->vCiArrivals).nCap < (int)uVar14) {
    piVar7 = (pLVar4->vCiArrivals).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc((long)(int)uVar14 << 2);
    }
    else {
      piVar7 = (int *)realloc(piVar7,(long)(int)uVar14 << 2);
    }
    (pLVar4->vCiArrivals).pArray = piVar7;
    if (piVar7 == (int *)0x0) {
LAB_0076e95b:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pLVar4->vCiArrivals).nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    memset((pLVar4->vCiArrivals).pArray,0,(ulong)uVar14 * 4);
  }
  (pLVar4->vCiArrivals).nSize = uVar14;
  iVar2 = pGia->nObjs;
  if (iVar2 < 1) {
    iVar15 = 0;
  }
  else {
    pGVar13 = pGia->pObjs;
    lVar12 = 0;
    iVar15 = 0;
    do {
      uVar14 = (uint)*(undefined8 *)pGVar13;
      if (((~uVar14 & 0x1fffffff) != 0 && -1 < (int)uVar14) &&
         (((uVar14 & 0x1fffffff) == 0x1fffffff ||
          ((uVar14 & 0x1fffffff) != ((uint)((ulong)*(undefined8 *)pGVar13 >> 0x20) & 0x1fffffff)))))
      {
        if ((pLVar4->vOffsets).nSize <= lVar12) goto LAB_0076e93c;
        (pLVar4->vOffsets).pArray[lVar12] = iVar15;
        iVar15 = iVar15 + 1;
        iVar2 = pGia->nObjs;
      }
      lVar12 = lVar12 + 1;
      pGVar13 = pGVar13 + 1;
    } while (lVar12 < iVar2);
  }
  if (iVar15 != (~(pGia->vCos->nSize + pGia->vCis->nSize) + iVar2) - pGia->nBufs) {
    __assert_fail("k == Gia_ManAndNotBufNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,0x7b6,"Lf_Man_t *Lf_ManAlloc(Gia_Man_t *, Jf_Par_t *)");
  }
  Lf_ManSetFlowRefs(pGia,&pLVar4->vFlowRefs,&pLVar4->vOffsets);
  pfVar10 = pPars->pTimesArr;
  if ((pfVar10 != (float *)0x0) && (pVVar6 = pGia->vCis, pGia->nRegs < pVVar6->nSize)) {
    lVar12 = 0;
    do {
      if ((pLVar4->vCiArrivals).nSize <= lVar12) {
LAB_0076e93c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pLVar4->vCiArrivals).pArray[lVar12] = (int)pfVar10[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 < (long)pVVar6->nSize - (long)pGia->nRegs);
  }
  return pLVar4;
}

Assistant:

Lf_Man_t * Lf_ManAlloc( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Lf_Man_t * p; int i, k = 0;
    assert( pPars->nCutNum > 1  && pPars->nCutNum <= LF_CUT_MAX );
    assert( pPars->nLutSize > 1 && pPars->nLutSize <= LF_LEAF_MAX );
    ABC_FREE( pGia->pRefs );
    Vec_IntFreeP( &pGia->vMapping );
    Gia_ManCleanValue( pGia );
    if ( Gia_ManHasChoices(pGia) )
        Gia_ManSetPhase(pGia);
    p = ABC_CALLOC( Lf_Man_t, 1 );
    Lf_ManAnalyzeCoDrivers( pGia, &p->nCoDrivers, &p->nInverters );
    if ( pPars->fPower )
        Lf_ManComputeSwitching( pGia, &p->vSwitches );
    p->clkStart  = Abc_Clock();
    p->pGia      = pGia;
    p->pPars     = pPars;
    p->nCutWords = (sizeof(Lf_Cut_t)/sizeof(int) + pPars->nLutSize + 1) >> 1;
    p->nSetWords = p->nCutWords * pPars->nCutNum;
    p->vTtMem    = pPars->fCutMin ? Vec_MemAllocForTT( pPars->nLutSize, 0 ) : NULL;
    if ( pPars->fCutMin && pPars->fUseMux7 )
        Vec_MemAddMuxTT( p->vTtMem, pPars->nLutSize );
    p->pObjBests = ABC_CALLOC( Lf_Bst_t, Gia_ManAndNotBufNum(pGia) );
    Vec_IntGrow( &p->vFreeSets, (1<<14) );
    Vec_PtrGrow( &p->vFreePages, 256 );
    Lf_MemAlloc( &p->vStoreOld, 16, &p->vFreePages, p->nCutWords );
    Lf_MemAlloc( &p->vStoreNew, 16, &p->vFreePages, p->nCutWords );
    Vec_IntFill( &p->vOffsets,  Gia_ManObjNum(pGia), -1 );
    Vec_IntFill( &p->vRequired, Gia_ManObjNum(pGia), ABC_INFINITY );
    Vec_IntFill( &p->vCutSets,  Gia_ManAndNotBufNum(pGia), -1 );
    Vec_FltFill( &p->vFlowRefs, Gia_ManAndNotBufNum(pGia), 0 );
    Vec_IntFill( &p->vMapRefs,  Gia_ManAndNotBufNum(pGia), 0 );
    Vec_IntFill( &p->vCiArrivals, Gia_ManCiNum(pGia), 0 );
    Gia_ManForEachAndId( pGia, i )
        if ( !Gia_ObjIsBuf(Gia_ManObj(pGia, i)) )
            Vec_IntWriteEntry( &p->vOffsets, i, k++ );
    assert( k == Gia_ManAndNotBufNum(pGia) );
    Lf_ManSetFlowRefs( pGia, &p->vFlowRefs, &p->vOffsets );
    if ( pPars->pTimesArr )
        for ( i = 0; i < Gia_ManPiNum(pGia); i++ )
            Vec_IntWriteEntry( &p->vCiArrivals, i, pPars->pTimesArr[i] );
    return p;
}